

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

void uv__async_spin(uv_async_t *handle)

{
  int local_24;
  int i;
  int *busy;
  int *pending;
  uv_async_t *handle_local;
  
  LOCK();
  handle->pending = 1;
  UNLOCK();
  do {
    for (local_24 = 0; local_24 < 0x3e5; local_24 = local_24 + 1) {
      if ((handle->u).fd == 0) {
        return;
      }
      uv__cpu_relax();
    }
    sched_yield();
  } while( true );
}

Assistant:

static void uv__async_spin(uv_async_t* handle) {
  _Atomic int* pending;
  _Atomic int* busy;
  int i;

  pending = (_Atomic int*) &handle->pending;
  busy = (_Atomic int*) &handle->u.fd;

  /* Set the pending flag first, so no new events will be added by other
   * threads after this function returns. */
  atomic_store(pending, 1);

  for (;;) {
    /* 997 is not completely chosen at random. It's a prime number, acyclic by
     * nature, and should therefore hopefully dampen sympathetic resonance.
     */
    for (i = 0; i < 997; i++) {
      if (atomic_load(busy) == 0)
        return;

      /* Other thread is busy with this handle, spin until it's done. */
      uv__cpu_relax();
    }

    /* Yield the CPU. We may have preempted the other thread while it's
     * inside the critical section and if it's running on the same CPU
     * as us, we'll just burn CPU cycles until the end of our time slice.
     */
    sched_yield();
  }
}